

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O1

Result __thiscall
GetOpt::OptionPresent::operator()
          (OptionPresent *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags param_4)

{
  undefined1 uVar1;
  Result RVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator iVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  
  p_Var3 = (short_ops->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &(short_ops->_M_t)._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var8->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      uVar1 = (undefined1)p_Var3[1]._M_color;
      if (this->short_opt <= (char)uVar1) {
        p_Var7 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(char)uVar1 < this->short_opt];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var8->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var8) &&
     (p_Var3 = p_Var7, this->short_opt < (char)p_Var7[1]._M_color)) {
    p_Var3 = &p_Var8->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var8) {
    if ((this->long_opt)._M_string_length == 0) {
      bVar6 = false;
      goto LAB_0010416f;
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
            ::find(&long_ops->_M_t,&this->long_opt);
    bVar9 = (_Rb_tree_header *)iVar5._M_node == &(long_ops->_M_t)._M_impl.super__Rb_tree_header;
    bVar6 = !bVar9;
    if (bVar9) goto LAB_0010416f;
    p_Var4 = iVar5._M_node + 2;
  }
  else {
    p_Var4 = (_Base_ptr)&p_Var3[1]._M_parent;
    bVar6 = true;
  }
  p_Var4->_M_color = _S_black;
LAB_0010416f:
  if (this->present == (bool *)0x0) {
    RVar2 = OptionNotFound_NoEx;
    if (bVar6 != false) {
      RVar2 = OK;
    }
  }
  else {
    *this->present = bVar6;
    RVar2 = OK;
  }
  return RVar2;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags /*flags*/) const
    {
        bool found;
        ShortOptions::iterator it = short_ops.find(short_opt);

        found = (it != short_ops.end());
        if (found)
        {
            it->second.flags = OptionData::CmdLine_Extracted;
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            found = (it != long_ops.end());
            if (found)
            {
                it->second.flags = OptionData::CmdLine_Extracted;
            }
        }

        if (present != NULL)
        {
            *present = found;
            return OK;
        }
        else
        {
            return found ? OK : OptionNotFound_NoEx;
        }
    }